

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# proto.cc
# Opt level: O0

bool __thiscall
absl::lts_20240722::log_internal::EncodeBytesTruncate
          (log_internal *this,uint64_t tag,Span<const_char> value,Span<char> *buf)

{
  bool bVar1;
  uint64_t uVar2;
  unsigned_long *puVar3;
  ulong uVar4;
  size_type sVar5;
  long lVar6;
  size_type sVar7;
  pointer __dest;
  pointer __src;
  size_type local_58;
  size_t local_50;
  size_t length_size;
  uint64_t length;
  size_t tag_type_size;
  uint64_t tag_type;
  Span<char> *buf_local;
  uint64_t tag_local;
  Span<const_char> value_local;
  
  tag_type = value.len_;
  value_local.ptr_ = value.ptr_;
  buf_local = (Span<char> *)this;
  tag_local = tag;
  tag_type_size = anon_unknown_2::MakeTagType((uint64_t)this,kLengthDelimited);
  length = VarintSize(tag_type_size);
  length_size = Span<const_char>::size((Span<const_char> *)&tag_local);
  local_58 = Span<char>::size((Span<char> *)tag_type);
  puVar3 = std::min<unsigned_long>(&length_size,&local_58);
  local_50 = VarintSize(*puVar3);
  uVar4 = length + local_50;
  sVar5 = Span<char>::size((Span<char> *)tag_type);
  if (uVar4 <= sVar5) {
    lVar6 = length + local_50;
    sVar5 = Span<const_char>::size((Span<const_char> *)&tag_local);
    sVar7 = Span<char>::size((Span<char> *)tag_type);
    if (sVar7 < lVar6 + sVar5) {
      lVar6 = length + local_50;
      sVar5 = Span<const_char>::size((Span<const_char> *)&tag_local);
      sVar7 = Span<char>::size((Span<char> *)tag_type);
      Span<const_char>::remove_suffix((Span<const_char> *)&tag_local,(lVar6 + sVar5) - sVar7);
      length_size = Span<const_char>::size((Span<const_char> *)&tag_local);
    }
  }
  lVar6 = length + local_50;
  sVar5 = Span<const_char>::size((Span<const_char> *)&tag_local);
  sVar7 = Span<char>::size((Span<char> *)tag_type);
  uVar2 = tag_type;
  bVar1 = lVar6 + sVar5 <= sVar7;
  if (bVar1) {
    anon_unknown_2::EncodeRawVarint(tag_type_size,length,(Span<char> *)tag_type);
    anon_unknown_2::EncodeRawVarint(length_size,local_50,(Span<char> *)tag_type);
    __dest = Span<char>::data((Span<char> *)tag_type);
    __src = Span<const_char>::data((Span<const_char> *)&tag_local);
    sVar5 = Span<const_char>::size((Span<const_char> *)&tag_local);
    memcpy(__dest,__src,sVar5);
    uVar2 = tag_type;
    sVar5 = Span<const_char>::size((Span<const_char> *)&tag_local);
    Span<char>::remove_prefix((Span<char> *)uVar2,sVar5);
  }
  else {
    sVar5 = Span<char>::size((Span<char> *)tag_type);
    Span<char>::remove_suffix((Span<char> *)uVar2,sVar5);
  }
  return bVar1;
}

Assistant:

bool EncodeBytesTruncate(uint64_t tag, absl::Span<const char> value,
                         absl::Span<char> *buf) {
  const uint64_t tag_type = MakeTagType(tag, WireType::kLengthDelimited);
  const size_t tag_type_size = VarintSize(tag_type);
  uint64_t length = value.size();
  const size_t length_size =
      VarintSize(std::min<uint64_t>(length, buf->size()));
  if (tag_type_size + length_size <= buf->size() &&
      tag_type_size + length_size + value.size() > buf->size()) {
    value.remove_suffix(tag_type_size + length_size + value.size() -
                        buf->size());
    length = value.size();
  }
  if (tag_type_size + length_size + value.size() > buf->size()) {
    buf->remove_suffix(buf->size());
    return false;
  }
  EncodeRawVarint(tag_type, tag_type_size, buf);
  EncodeRawVarint(length, length_size, buf);
  memcpy(buf->data(), value.data(), value.size());
  buf->remove_prefix(value.size());
  return true;
}